

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::SelectionSet::parallelReduce(SelectionSet *__return_storage_ptr__,SelectionSet *this)

{
  _Bvector_base<std::allocator<bool>_> *this_00;
  long lVar1;
  OpenMDBitSet local_50;
  
  SelectionSet(__return_storage_ptr__);
  lVar1 = 0;
  do {
    OpenMDBitSet::parallelReduce
              (&local_50,
               (OpenMDBitSet *)
               ((long)&(((this->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1));
    this_00 = (_Bvector_base<std::allocator<bool>_> *)
              ((long)&(((__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_> + lVar1);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate(this_00);
    (this_00->_M_impl).super__Bvector_impl_data._M_end_of_storage =
         local_50.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_end_of_storage;
    (this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         local_50.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    (this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
         local_50.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    *(undefined4 *)
     &(this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base.field_0xc =
         local_50.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
    (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         local_50.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
         local_50.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
    *(undefined4 *)
     &(this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base.field_0xc =
         local_50.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
    lVar1 = lVar1 + 0x28;
  } while (lVar1 != 0xf0);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionSet::parallelReduce() {
    SelectionSet result;
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] = bitsets_[i].parallelReduce();

    return result;
  }